

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::framebuffer_texture2d(NegativeTestContext *ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ContextType ctxType;
  GLuint texBuf;
  GLuint tex2D;
  GLint maxTexSize;
  GLuint texCube;
  string local_60;
  allocator<char> local_3d;
  GLint maxTexCubeSize;
  GLuint tex2DMS;
  GLuint fbo;
  
  fbo = 0x1234;
  tex2D = 0x1234;
  texCube = 0x1234;
  tex2DMS = 0x1234;
  maxTexSize = 0x1234;
  maxTexCubeSize = 0x1234;
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&tex2D);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,tex2D);
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texCube);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,texCube);
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&tex2DMS);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9100,tex2DMS);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0xd33,&maxTexSize);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x851c,&maxTexCubeSize);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",
             (allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0xffffffff,0x8ce0,0xde1,0,0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_ENUM is generated if textarget is not an accepted texture target.",
             (allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xffffffff,tex2D,0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_ENUM is generated if attachment is not an accepted token.",
             (allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0xffffffff,0xde1,tex2D,0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if level is less than 0 or larger than log_2 of maximum texture size."
             ,(allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2D,-1);
  NegativeTestContext::expectError(ctx,0x501);
  uVar3 = 0x20;
  uVar2 = uVar3;
  if (maxTexSize != 0) {
    uVar2 = 0x1f;
    if (maxTexSize != 0) {
      for (; (uint)maxTexSize >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2D,0x20 - uVar2);
  NegativeTestContext::expectError(ctx,0x501);
  if (maxTexSize != 0) {
    uVar3 = 0x1f;
    if (maxTexSize != 0) {
      for (; (uint)maxTexSize >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0x8515,texCube,0x20 - uVar3);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if level is larger than maximum texture size.",
             (allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2D,maxTexSize + 1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2D,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0x8519,texCube,maxTexCubeSize + 1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0x8519,texCube,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0x9100,tex2DMS,1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object."
             ,(allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0xffffffff,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_OPERATION is generated if textarget and texture are not compatible.",
             (allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0x8515,tex2D,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0x9100,tex2D,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,texCube,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2DMS,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&tex2D);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texCube);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&tex2DMS);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"GL_INVALID_OPERATION is generated if zero is bound to target.",
             (allocator<char> *)&texBuf);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glFramebufferTexture2D(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    texBuf = 0x1234;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "GL_INVALID_OPERATION error is generated if texture is the name of a buffer texture."
               ,&local_3d);
    NegativeTestContext::beginSection(ctx,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texBuf);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c2a,texBuf);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,texBuf,0);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
  }
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  return;
}

Assistant:

void framebuffer_texture2d (NegativeTestContext& ctx)
{
	GLuint	fbo				= 0x1234;
	GLuint	tex2D			= 0x1234;
	GLuint	texCube			= 0x1234;
	GLuint	tex2DMS			= 0x1234;
	GLint	maxTexSize		= 0x1234;
	GLint	maxTexCubeSize	= 0x1234;
	int		maxSize			= 0x1234;

	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glGenTextures(1, &tex2D);
	ctx.glBindTexture(GL_TEXTURE_2D, tex2D);
	ctx.glGenTextures(1, &texCube);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	ctx.glGenTextures(1, &tex2DMS);
	ctx.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, tex2DMS);
	ctx.glGetIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
	ctx.glGetIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE, &maxTexCubeSize);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glFramebufferTexture2D(-1, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if textarget is not an accepted texture target.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, -1, tex2D, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if attachment is not an accepted token.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, -1, GL_TEXTURE_2D, tex2D, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0 or larger than log_2 of maximum texture size.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, -1);
	ctx.expectError(GL_INVALID_VALUE);
	maxSize = deLog2Floor32(maxTexSize) + 1;
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, maxSize);
	ctx.expectError(GL_INVALID_VALUE);
	maxSize = deLog2Floor32(maxTexSize) + 1;
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X, texCube, maxSize);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is larger than maximum texture size.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, maxTexSize + 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, texCube, maxTexCubeSize + 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, texCube, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex2DMS, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, -1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if textarget and texture are not compatible.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X, tex2D, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex2D, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texCube, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2DMS, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glDeleteTextures(1, &tex2D);
	ctx.glDeleteTextures(1, &texCube);
	ctx.glDeleteTextures(1, &tex2DMS);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if zero is bound to target.");
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		GLuint texBuf = 0x1234;
		ctx.beginSection("GL_INVALID_OPERATION error is generated if texture is the name of a buffer texture.");
		ctx.glGenTextures(1, &texBuf);
		ctx.glBindTexture(GL_TEXTURE_BUFFER, texBuf);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.expectError(GL_NO_ERROR);
		ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texBuf, 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();
	}

	ctx.glDeleteFramebuffers(1, &fbo);
}